

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseSingleLocalizedDigit
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,int32_t *len)

{
  short sVar1;
  int iVar2;
  UChar32 c;
  uint uVar3;
  int32_t iVar4;
  int32_t i;
  uint uVar5;
  long lVar6;
  
  *len = 0;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  uVar5 = 0xffffffff;
  if (start < iVar2) {
    c = UnicodeString::char32At(text,start);
    lVar6 = 0;
    do {
      if (c == this->fGMTOffsetDigits[lVar6]) goto LAB_001f885d;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    lVar6 = 0xffffffff;
LAB_001f885d:
    uVar5 = (uint)lVar6;
    if ((int)(uint)lVar6 < 0) {
      uVar3 = u_charDigitValue_63(c);
      uVar5 = 0xffffffff;
      if (uVar3 < 10) {
        uVar5 = uVar3;
      }
    }
    if (-1 < (int)uVar5) {
      iVar4 = UnicodeString::moveIndex32(text,start,1);
      *len = iVar4 - start;
    }
  }
  return uVar5;
}

Assistant:

int32_t
TimeZoneFormat::parseSingleLocalizedDigit(const UnicodeString& text, int32_t start, int32_t& len) const {
    int32_t digit = -1;
    len = 0;
    if (start < text.length()) {
        UChar32 cp = text.char32At(start);

        // First, try digits configured for this instance
        for (int32_t i = 0; i < 10; i++) {
            if (cp == fGMTOffsetDigits[i]) {
                digit = i;
                break;
            }
        }
        // If failed, check if this is a Unicode digit
        if (digit < 0) {
            int32_t tmp = u_charDigitValue(cp);
            digit = (tmp >= 0 && tmp <= 9) ? tmp : -1;
        }

        if (digit >= 0) {
            int32_t next = text.moveIndex32(start, 1);
            len = next - start;
        }
    }
    return digit;
}